

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_diagnostics(options_i *options,vw *all)

{
  bool bVar1;
  int iVar2;
  option_group_definition *poVar3;
  long lVar4;
  ostream *poVar5;
  float fVar6;
  double dVar7;
  bool version_arg;
  bool help;
  string progress_arg;
  option_group_definition diagnostic_group;
  bool local_88f;
  bool local_88e;
  allocator local_88d;
  allocator local_88c;
  allocator local_88b;
  allocator local_88a;
  allocator local_889;
  allocator local_888;
  allocator local_887;
  allocator local_886;
  allocator local_885;
  allocator local_884;
  allocator local_883;
  allocator local_882;
  allocator local_881;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  string local_860 [32];
  string local_840 [32];
  string local_820;
  string local_800 [32];
  string local_7e0;
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780;
  string local_760 [32];
  string local_740 [32];
  string local_720;
  string local_700 [32];
  string local_6e0;
  string local_6c0;
  undefined1 local_6a0 [160];
  option_group_definition local_600;
  undefined1 local_5c8 [80];
  string local_578 [80];
  undefined1 local_528 [80];
  string local_4d8 [80];
  undefined1 local_488 [80];
  string local_438 [80];
  undefined1 local_3e8 [160];
  typed_option<bool> local_348;
  typed_option<bool> local_2a8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  typed_option<bool> local_168;
  typed_option<bool> local_c8;
  
  local_88f = false;
  local_88e = false;
  local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
  local_880._M_string_length = 0;
  local_880.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_6c0,"Diagnostic options",(allocator *)local_6a0);
  VW::config::option_group_definition::option_group_definition(&local_600,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::string((string *)&local_6e0,"version",&local_881);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_6a0,&local_6e0,&local_88f);
  std::__cxx11::string::string(local_700,"Version information",&local_882);
  std::__cxx11::string::_M_assign((string *)(local_6a0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_c8,(typed_option<bool> *)local_6a0);
  poVar3 = VW::config::option_group_definition::add<bool>(&local_600,&local_c8);
  std::__cxx11::string::string((string *)&local_720,"audit",&local_883);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5c8,&local_720,&all->audit);
  std::__cxx11::string::string(local_740,"a",&local_884);
  std::__cxx11::string::_M_assign(local_578);
  std::__cxx11::string::string(local_760,"print weights of features",&local_885);
  std::__cxx11::string::_M_assign((string *)(local_5c8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_168,(typed_option<bool> *)local_5c8);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_168);
  std::__cxx11::string::string((string *)&local_780,"progress",&local_886);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_488,&local_780,&local_880);
  std::__cxx11::string::string(local_7a0,"P",&local_887);
  std::__cxx11::string::_M_assign(local_438);
  std::__cxx11::string::string
            (local_7c0,"Progress update frequency. int: additive, float: multiplicative",&local_888)
  ;
  std::__cxx11::string::_M_assign((string *)(local_488 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_208,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_488);
  poVar3 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar3,&local_208);
  std::__cxx11::string::string((string *)&local_7e0,"quiet",&local_889);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3e8,&local_7e0,&all->quiet);
  std::__cxx11::string::string
            (local_800,"Don\'t output disgnostics and progress updates",&local_88a);
  std::__cxx11::string::_M_assign((string *)(local_3e8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2a8,(typed_option<bool> *)local_3e8);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_2a8);
  std::__cxx11::string::string((string *)&local_820,"help",&local_88b);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_528,&local_820,&local_88e);
  std::__cxx11::string::string(local_840,"h",&local_88c);
  std::__cxx11::string::_M_assign(local_4d8);
  std::__cxx11::string::string
            (local_860,"Look here: http://hunch.net/~vw/ and click on Tutorial.",&local_88d);
  std::__cxx11::string::_M_assign((string *)(local_528 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_348,(typed_option<bool> *)local_528);
  VW::config::option_group_definition::add<bool>(poVar3,&local_348);
  VW::config::typed_option<bool>::~typed_option(&local_348);
  std::__cxx11::string::~string(local_860);
  std::__cxx11::string::~string(local_840);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_528);
  std::__cxx11::string::~string((string *)&local_820);
  VW::config::typed_option<bool>::~typed_option(&local_2a8);
  std::__cxx11::string::~string(local_800);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_3e8);
  std::__cxx11::string::~string((string *)&local_7e0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_208);
  std::__cxx11::string::~string(local_7c0);
  std::__cxx11::string::~string(local_7a0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_488);
  std::__cxx11::string::~string((string *)&local_780);
  VW::config::typed_option<bool>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_760);
  std::__cxx11::string::~string(local_740);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_5c8);
  std::__cxx11::string::~string((string *)&local_720);
  VW::config::typed_option<bool>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_700);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_6a0);
  std::__cxx11::string::~string((string *)&local_6e0);
  (**options->_vptr_options_i)(options,&local_600);
  if (local_88f != true) {
    std::__cxx11::string::string((string *)local_6a0,"progress",(allocator *)local_5c8);
    iVar2 = (*options->_vptr_options_i[1])(options,local_6a0);
    if ((char)iVar2 == '\0') {
      std::__cxx11::string::~string((string *)local_6a0);
    }
    else {
      bVar1 = all->quiet;
      std::__cxx11::string::~string((string *)local_6a0);
      if (bVar1 == false) {
        dVar7 = atof(local_880._M_dataplus._M_p);
        all->progress_arg = (float)dVar7;
        lVar4 = std::__cxx11::string::find_first_of((char *)&local_880,0x235685);
        if (lVar4 == -1) {
          all->progress_add = true;
          fVar6 = all->progress_arg;
          if (fVar6 < 1.0) {
            poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                                     "warning: additive --progress <int>");
            poVar5 = std::operator<<(poVar5," can\'t be < 1: forcing to 1");
            std::endl<char,std::char_traits<char>>(poVar5);
            all->progress_arg = 1.0;
            fVar6 = 1.0;
          }
          all->sd->dump_interval = fVar6;
        }
        else {
          all->progress_add = false;
          if (all->progress_arg <= 1.0) {
            poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                                     "warning: multiplicative --progress <float>: ");
            poVar5 = std::operator<<(poVar5,(string *)&local_880);
            poVar5 = std::operator<<(poVar5," is <= 1.0: adding 1.0");
            std::endl<char,std::char_traits<char>>(poVar5);
            all->progress_arg = all->progress_arg + 1.0;
          }
          else if (9.0 < all->progress_arg) {
            poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                                     "warning: multiplicative --progress <float>");
            poVar5 = std::operator<<(poVar5," is > 9.0: you probably meant to use an integer");
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          all->sd->dump_interval = 1.0;
        }
      }
    }
    VW::config::option_group_definition::~option_group_definition(&local_600);
    std::__cxx11::string::~string((string *)&local_880);
    return;
  }
  version_struct::to_string_abi_cxx11_((string *)local_6a0,&version);
  poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_6a0);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)local_6a0);
  exit(0);
}

Assistant:

void parse_diagnostics(options_i& options, vw& all)
{
  bool version_arg = false;
  bool help = false;
  std::string progress_arg;
  option_group_definition diagnostic_group("Diagnostic options");
  diagnostic_group.add(make_option("version", version_arg).help("Version information"))
      .add(make_option("audit", all.audit).short_name("a").help("print weights of features"))
      .add(make_option("progress", progress_arg)
               .short_name("P")
               .help("Progress update frequency. int: additive, float: multiplicative"))
      .add(make_option("quiet", all.quiet).help("Don't output disgnostics and progress updates"))
      .add(make_option("help", help).short_name("h").help("Look here: http://hunch.net/~vw/ and click on Tutorial."));

  options.add_and_parse(diagnostic_group);

  // Upon direct query for version -- spit it out to stdout
  if (version_arg)
  {
    cout << version.to_string() << "\n";
    exit(0);
  }

  if (options.was_supplied("progress") && !all.quiet)
  {
    all.progress_arg = (float)::atof(progress_arg.c_str());
    // --progress interval is dual: either integer or floating-point
    if (progress_arg.find_first_of(".") == string::npos)
    {
      // No "." in arg: assume integer -> additive
      all.progress_add = true;
      if (all.progress_arg < 1)
      {
        all.trace_message << "warning: additive --progress <int>"
                          << " can't be < 1: forcing to 1" << endl;
        all.progress_arg = 1;
      }
      all.sd->dump_interval = all.progress_arg;
    }
    else
    {
      // A "." in arg: assume floating-point -> multiplicative
      all.progress_add = false;

      if (all.progress_arg <= 1.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>: " << progress_arg << " is <= 1.0: adding 1.0"
                          << endl;
        all.progress_arg += 1.0;
      }
      else if (all.progress_arg > 9.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>"
                          << " is > 9.0: you probably meant to use an integer" << endl;
      }
      all.sd->dump_interval = 1.0;
    }
  }
}